

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
          (optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_38;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::
    get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
              (&local_38,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) {
      *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
           local_38.contained.data.__align;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_38.contained._16_8_;
      local_38.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_38.contained._8_8_ = 0;
      local_38.contained._16_8_ = 0;
    }
    nonstd::optional_lite::
    optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
    ~optional(&local_38);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }